

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O0

ma_result ma_rb_init_ex(size_t subbufferSizeInBytes,size_t subbufferCount,
                       size_t subbufferStrideInBytes,void *pOptionalPreallocatedBuffer,
                       ma_allocation_callbacks *pAllocationCallbacks,ma_rb *pRB)

{
  size_t sz;
  void *pvVar1;
  size_t bufferSizeInBytes;
  ma_uint32 maxSubBufferSize;
  ma_result result;
  ma_rb *pRB_local;
  ma_allocation_callbacks *pAllocationCallbacks_local;
  void *pOptionalPreallocatedBuffer_local;
  size_t subbufferStrideInBytes_local;
  size_t subbufferCount_local;
  size_t subbufferSizeInBytes_local;
  
  if (pRB == (ma_rb *)0x0) {
    subbufferSizeInBytes_local._4_4_ = -2;
  }
  else if ((subbufferSizeInBytes == 0) || (subbufferCount == 0)) {
    subbufferSizeInBytes_local._4_4_ = -2;
  }
  else if (subbufferSizeInBytes < 0x7fffffc1) {
    memset(pRB,0,0x40);
    subbufferSizeInBytes_local._4_4_ =
         ma_allocation_callbacks_init_copy(&pRB->allocationCallbacks,pAllocationCallbacks);
    if (subbufferSizeInBytes_local._4_4_ == 0) {
      pRB->subbufferSizeInBytes = (ma_uint32)subbufferSizeInBytes;
      pRB->subbufferCount = (ma_uint32)subbufferCount;
      if (pOptionalPreallocatedBuffer == (void *)0x0) {
        pRB->subbufferStrideInBytes = pRB->subbufferSizeInBytes + 0x3f & 0xffffffbf;
        sz = (ulong)pRB->subbufferCount * (ulong)pRB->subbufferStrideInBytes;
        pvVar1 = ma_aligned_malloc(sz,0x40,&pRB->allocationCallbacks);
        pRB->pBuffer = pvVar1;
        if (pRB->pBuffer == (void *)0x0) {
          return -4;
        }
        memset(pRB->pBuffer,0,sz);
        pRB->ownsBuffer = '\x01';
      }
      else {
        pRB->subbufferStrideInBytes = (ma_uint32)subbufferStrideInBytes;
        pRB->pBuffer = pOptionalPreallocatedBuffer;
      }
      subbufferSizeInBytes_local._4_4_ = 0;
    }
  }
  else {
    subbufferSizeInBytes_local._4_4_ = -2;
  }
  return subbufferSizeInBytes_local._4_4_;
}

Assistant:

MA_API ma_result ma_rb_init_ex(size_t subbufferSizeInBytes, size_t subbufferCount, size_t subbufferStrideInBytes, void* pOptionalPreallocatedBuffer, const ma_allocation_callbacks* pAllocationCallbacks, ma_rb* pRB)
{
    ma_result result;
    const ma_uint32 maxSubBufferSize = 0x7FFFFFFF - (MA_SIMD_ALIGNMENT-1);

    if (pRB == NULL) {
        return MA_INVALID_ARGS;
    }

    if (subbufferSizeInBytes == 0 || subbufferCount == 0) {
        return MA_INVALID_ARGS;
    }

    if (subbufferSizeInBytes > maxSubBufferSize) {
        return MA_INVALID_ARGS;    /* Maximum buffer size is ~2GB. The most significant bit is a flag for use internally. */
    }


    MA_ZERO_OBJECT(pRB);

    result = ma_allocation_callbacks_init_copy(&pRB->allocationCallbacks, pAllocationCallbacks);
    if (result != MA_SUCCESS) {
        return result;
    }

    pRB->subbufferSizeInBytes = (ma_uint32)subbufferSizeInBytes;
    pRB->subbufferCount = (ma_uint32)subbufferCount;

    if (pOptionalPreallocatedBuffer != NULL) {
        pRB->subbufferStrideInBytes = (ma_uint32)subbufferStrideInBytes;
        pRB->pBuffer = pOptionalPreallocatedBuffer;
    } else {
        size_t bufferSizeInBytes;

        /*
        Here is where we allocate our own buffer. We always want to align this to MA_SIMD_ALIGNMENT for future SIMD optimization opportunity. To do this
        we need to make sure the stride is a multiple of MA_SIMD_ALIGNMENT.
        */
        pRB->subbufferStrideInBytes = (pRB->subbufferSizeInBytes + (MA_SIMD_ALIGNMENT-1)) & ~MA_SIMD_ALIGNMENT;

        bufferSizeInBytes = (size_t)pRB->subbufferCount*pRB->subbufferStrideInBytes;
        pRB->pBuffer = ma_aligned_malloc(bufferSizeInBytes, MA_SIMD_ALIGNMENT, &pRB->allocationCallbacks);
        if (pRB->pBuffer == NULL) {
            return MA_OUT_OF_MEMORY;
        }

        MA_ZERO_MEMORY(pRB->pBuffer, bufferSizeInBytes);
        pRB->ownsBuffer = MA_TRUE;
    }

    return MA_SUCCESS;
}